

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VL1NormLocal(N_Vector X,sunindextype param_2,int myid)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  timespec spec;
  undefined4 local_48;
  timespec local_30;
  
  set_element_range(X,0,param_2 + -1,-(double)myid / (double)param_2);
  iVar5 = 1;
  clock_gettime(1,&local_30);
  lVar3 = local_30.tv_sec - base_time_tv_sec;
  dVar1 = (double)local_30.tv_nsec;
  dVar6 = (double)N_VL1NormLocal(X);
  sync_device(X);
  clock_gettime(1,&local_30);
  lVar4 = local_30.tv_sec - base_time_tv_sec;
  if (0.0 <= dVar6) {
    local_48 = SUB84((double)myid,0);
    iVar2 = SUNRCompareTol(dVar6,local_48,0x3e50000000000000);
    if (iVar2 == 0) {
      iVar5 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VL1NormLocal");
      }
      goto LAB_0010ef1a;
    }
  }
  printf(">>> FAILED test -- N_VL1NormLocal, Proc %d\n",(ulong)(uint)myid);
LAB_0010ef1a:
  max_time(X,((double)local_30.tv_nsec / 1000000000.0 + (double)lVar4) -
             (dVar1 / 1000000000.0 + (double)lVar3));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VL1NormLocal");
  }
  return iVar5;
}

Assistant:

int Test_N_VL1NormLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, val;

  /* fill vector data */
  val = -(ONE * myid) / local_length;
  set_element_range(X, 0, local_length - 1, val);

  start_time = get_time();
  ans        = N_VL1NormLocal(X);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myid */
  failure = (ans < ZERO) ? 1
                         : SUNRCompareTol(ans, (sunrealtype)myid,
                                          SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VL1NormLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VL1NormLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VL1NormLocal", maxt);

  return (fails);
}